

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<float>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  unsigned_short ***pppuVar5;
  float *pfVar6;
  unsigned_short *puVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  setSize(this,a->width,a->height,(long)a->depth);
  iVar1 = this->depth;
  if (0 < (long)iVar1) {
    lVar2 = this->width;
    lVar3 = this->height;
    lVar9 = 0;
    do {
      if (0 < lVar3) {
        pppfVar4 = a->img;
        pppuVar5 = this->img;
        lVar10 = 0;
        do {
          if (0 < lVar2) {
            pfVar6 = pppfVar4[lVar9][lVar10];
            puVar7 = pppuVar5[lVar9][lVar10];
            lVar11 = 0;
            do {
              iVar8 = (int)pfVar6[lVar11];
              if (0xfffe < iVar8) {
                iVar8 = 0xffff;
              }
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              puVar7[lVar11] = (unsigned_short)iVar8;
              lVar11 = lVar11 + 1;
            } while (lVar2 != lVar11);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar3);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }